

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

int Gia_CommandSpecI(Gia_Man_t *pGia,int nFramesInit,int nBTLimitInit,int fStart,int fCheckMiter,
                    int fVerbose)

{
  Abc_Cex_t *pCex;
  int iVar1;
  Gia_Man_t *pGVar2;
  Aig_Man_t *pAig;
  Gia_Man_t *pInit;
  int iVar3;
  char *format;
  ulong uVar4;
  bool bVar5;
  Cec_ParSim_t Pars;
  
  format = "Gia_CommandSpecI(): Equivalence classes are not defined.\n";
  iVar3 = 0;
  if ((pGia->pReprs != (Gia_Rpr_t *)0x0) && (iVar3 = 0, pGia->pNexts != (int *)0x0)) {
    Gia_ManCleanMark0(pGia);
    Gia_ManPrintStats(pGia,(Gps_Par_t *)0x0);
    iVar1 = Gia_ManHasNoEquivs(pGia);
    iVar3 = 1;
    format = "Gia_CommandSpecI: No equivalences left.\n";
    if (iVar1 == 0) {
      uVar4 = 0;
      iVar3 = 0;
      do {
        Abc_Print(1,"ITER %3d : ",uVar4);
        Gia_ManPrintStatsClasses(pGia);
        iVar1 = Cec_ManCheckNonTrivialCands(pGia);
        if (iVar1 == 0) {
          format = 
          "Gia_CommandSpecI: There are only trivial equiv candidates left (PO drivers). Quitting.\n"
          ;
          iVar3 = 1;
          goto LAB_00202db4;
        }
        pGVar2 = Gia_ManSpecReduce(pGia,0,0,1,0,0);
        pAig = Gia_ManToAig(pGVar2,0);
        Gia_ManStop(pGVar2);
        Saig_BmcPerform(pAig,iVar3,nFramesInit,2000,0,nBTLimitInit,2000000,fVerbose,0,(int *)0x0,0,0
                       );
        pCex = pAig->pSeqModel;
        pAig->pSeqModel = (Abc_Cex_t *)0x0;
        Aig_ManStop(pAig);
        if (pCex == (Abc_Cex_t *)0x0) {
          bVar5 = false;
          Abc_Print(1,"Gia_CommandSpecI(): Internal BMC could not find a counter-example.\n");
        }
        else {
          if (fStart != 0) {
            iVar3 = pCex->iFrame;
          }
          Cec_ManSimSetDefaultParams(&Pars);
          Pars.fCheckMiter = fCheckMiter;
          iVar1 = Cec_ManSeqResimulateCounter(pGia,&Pars,pCex);
          bVar5 = iVar1 == 0;
          free(pCex);
        }
        if (!bVar5) {
          return 1;
        }
        Gia_AigerWrite(pGia,"gore.aig",0,0,0);
        pGVar2 = Gia_ManSpecReduce(pGia,0,0,1,0,0);
        if (pGVar2 != (Gia_Man_t *)0x0) {
          pInit = Gia_ManSeqStructSweep(pGVar2,1,1,0);
          Gia_ManStop(pGVar2);
          Gia_AigerWrite(pInit,"gsrm.aig",0,0,0);
          Gia_ManStop(pInit);
        }
        uVar4 = (ulong)((int)uVar4 + 1);
        iVar1 = Gia_ManHasNoEquivs(pGia);
      } while (iVar1 == 0);
      iVar3 = 1;
      format = "Gia_CommandSpecI: No equivalences left.\n";
    }
  }
LAB_00202db4:
  Abc_Print(1,format);
  return iVar3;
}

Assistant:

int Gia_CommandSpecI( Gia_Man_t * pGia, int nFramesInit, int nBTLimitInit, int fStart, int fCheckMiter, int fVerbose )
{
//    extern int Cec_ManCheckNonTrivialCands( Gia_Man_t * pAig );
    Aig_Man_t * pTemp;
    Gia_Man_t * pSrm, * pReduce, * pAux;
    int nIter, nStart = 0;
    if ( pGia->pReprs == NULL || pGia->pNexts == NULL )
    {
        Abc_Print( 1, "Gia_CommandSpecI(): Equivalence classes are not defined.\n" );
        return 0;
    }
    // (spech)*  where spech = &srm; restore save3; bmc2 -F 100 -C 25000; &resim
    Gia_ManCleanMark0( pGia );
    Gia_ManPrintStats( pGia, NULL );
    for ( nIter = 0; ; nIter++ )
    {
        if ( Gia_ManHasNoEquivs(pGia) )
        {
            Abc_Print( 1, "Gia_CommandSpecI: No equivalences left.\n" );
            break;
        }
        Abc_Print( 1, "ITER %3d : ", nIter );
//      if ( fVerbose )
//            Abc_Print( 1, "Starting BMC from frame %d.\n", nStart );
//      if ( fVerbose )
//            Gia_ManPrintStats( pGia, 0 );
            Gia_ManPrintStatsClasses( pGia );
        // perform speculative reduction
//        if ( Gia_ManPoNum(pSrm) <= Gia_ManPoNum(pGia) )
        if ( !Cec_ManCheckNonTrivialCands(pGia) )
        {
            Abc_Print( 1, "Gia_CommandSpecI: There are only trivial equiv candidates left (PO drivers). Quitting.\n" );
            break;
        }
        pSrm = Gia_ManSpecReduce( pGia, 0, 0, 1, 0, 0 );
        // bmc2 -F 100 -C 25000
        {
            Abc_Cex_t * pCex;
            int nFrames     = nFramesInit; // different from default
            int nNodeDelta  = 2000;
            int nBTLimit    = nBTLimitInit; // different from default
            int nBTLimitAll = 2000000;
            pTemp = Gia_ManToAig( pSrm, 0 );
//            Aig_ManPrintStats( pTemp );
            Gia_ManStop( pSrm );
            Saig_BmcPerform( pTemp, nStart, nFrames, nNodeDelta, 0, nBTLimit, nBTLimitAll, fVerbose, 0, NULL, 0, 0 );
            pCex = pTemp->pSeqModel; pTemp->pSeqModel = NULL;
            Aig_ManStop( pTemp );
            if ( pCex == NULL )
            {
                Abc_Print( 1, "Gia_CommandSpecI(): Internal BMC could not find a counter-example.\n" );
                break;
            }
            if ( fStart )
                nStart = pCex->iFrame;
            // perform simulation
            {
                Cec_ParSim_t Pars, * pPars = &Pars;
                Cec_ManSimSetDefaultParams( pPars );
                pPars->fCheckMiter = fCheckMiter;
                if ( Cec_ManSeqResimulateCounter( pGia, pPars, pCex ) )
                {
                    ABC_FREE( pCex );
                    break;
                }
                ABC_FREE( pCex );
            }
        }
        // write equivalence classes
        Gia_AigerWrite( pGia, "gore.aig", 0, 0, 0 );
        // reduce the model
        pReduce = Gia_ManSpecReduce( pGia, 0, 0, 1, 0, 0 );
        if ( pReduce )
        {
            pReduce = Gia_ManSeqStructSweep( pAux = pReduce, 1, 1, 0 );
            Gia_ManStop( pAux );
            Gia_AigerWrite( pReduce, "gsrm.aig", 0, 0, 0 );
//            Abc_Print( 1, "Speculatively reduced model was written into file \"%s\".\n", "gsrm.aig" );
//          Gia_ManPrintStatsShort( pReduce );
            Gia_ManStop( pReduce );
        }
    }
    return 1;
}